

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

RawAccessChain
dxil_spv::emit_raw_access_chain
          (Impl *impl,ResourceMeta *meta,CallInst *inst,Type *element_type,uint vecsize)

{
  bool bVar1;
  TypeID TVar2;
  Id component;
  Id pointee;
  Id IVar3;
  int iVar4;
  uint uVar5;
  Id arg;
  Builder *this;
  Operation *this_00;
  Value *pVVar6;
  Value *pVVar7;
  uint vecsize_00;
  uint32_t lit;
  RawAccessChain RVar8;
  
  this = Converter::Impl::builder(impl);
  if ((((impl->execution_mode_meta).native_16bit_operations == false) &&
      ((impl->options).min_precision_prefer_native_16bit == true)) &&
     (bVar1 = type_is_16bit(element_type), bVar1)) {
    TVar2 = LLVMBC::Type::getTypeID(element_type);
    if (TVar2 == HalfTyID) {
      component = spv::Builder::makeFloatType(this,0x20);
    }
    else {
      component = spv::Builder::makeUintType(this,0x20);
    }
  }
  else {
    component = Converter::Impl::get_type_id(impl,element_type,0);
  }
  pointee = component;
  if (1 < vecsize) {
    pointee = spv::Builder::makeVectorType(this,component,vecsize);
  }
  IVar3 = spv::Builder::makePointer(this,StorageClassStorageBuffer,pointee);
  spv::Builder::addCapability(this,CapabilityRawAccessChainsNV);
  spv::Builder::addExtension(this,"SPV_NV_raw_access_chains");
  this_00 = Converter::Impl::allocate(impl,OpRawAccessChainNV,IVar3);
  pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  Operation::add_id(this_00,IVar3);
  iVar4 = spv::Builder::getScalarTypeWidth(this,component);
  iVar4 = iVar4 / 8;
  if (meta->kind != RawBuffer) {
    IVar3 = spv::Builder::makeUintConstant(this,meta->stride,false);
    Operation::add_id(this_00,IVar3);
    pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    IVar3 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(this_00,IVar3);
    pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
    IVar3 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(this_00,IVar3);
    Operation::add_literal(this_00,2);
    uVar5 = meta->stride;
    if ((uVar5 & iVar4 * 4 - 1U) == 0) {
      pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      uVar5 = meta->stride;
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
      vecsize_00 = 4;
      bVar1 = raw_access_structured_can_vectorize(impl,element_type,pVVar6,uVar5,pVVar7,4);
      if (bVar1) goto LAB_00167a70;
      uVar5 = meta->stride;
    }
    if ((uVar5 & iVar4 * 2 - 1U) == 0) {
      pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      uVar5 = meta->stride;
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
      vecsize_00 = 2;
      bVar1 = raw_access_structured_can_vectorize(impl,element_type,pVVar6,uVar5,pVVar7,2);
      if (bVar1) goto LAB_00167a70;
    }
    vecsize_00 = 1;
    goto LAB_00167a70;
  }
  uVar5 = raw_buffer_data_type_to_addr_shift_log2(impl,element_type);
  pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
  bVar1 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar6,4);
  vecsize_00 = 4;
  if (bVar1) {
LAB_0016784d:
    if ((vecsize_00 < vecsize) || (0x10 < vecsize_00 * iVar4)) goto LAB_00167a16;
    pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    IVar3 = build_index_divider(impl,pVVar6,uVar5,vecsize_00);
    arg = spv::Builder::makeUintConstant(this,vecsize_00 * iVar4,false);
    Operation::add_id(this_00,arg);
    Operation::add_id(this_00,IVar3);
    IVar3 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(this_00,IVar3);
    lit = 2;
  }
  else {
    pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    bVar1 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar6,2);
    vecsize_00 = 2;
    if (bVar1) goto LAB_0016784d;
    vecsize_00 = 1;
LAB_00167a16:
    IVar3 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(this_00,IVar3);
    IVar3 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(this_00,IVar3);
    pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    IVar3 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(this_00,IVar3);
    lit = 1;
  }
  Operation::add_literal(this_00,lit);
LAB_00167a70:
  IVar3 = this_00->id;
  Converter::Impl::add(impl,this_00,false);
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(this,this_00->id,DecorationNonUniform,-1);
  }
  if ((meta->physical_pointer_meta).nonwritable == true) {
    spv::Builder::addDecoration(this,this_00->id,DecorationNonWritable,-1);
  }
  if ((meta->physical_pointer_meta).coherent == true) {
    spv::Builder::addDecoration(this,this_00->id,DecorationCoherent,-1);
  }
  RVar8.alignment = vecsize_00 * iVar4;
  RVar8.vector_type_id = pointee;
  RVar8.component_type_id = component;
  RVar8.ptr_id = IVar3;
  return RVar8;
}

Assistant:

static RawAccessChain emit_raw_access_chain(Converter::Impl &impl, const Converter::Impl::ResourceMeta &meta,
                                            const llvm::CallInst *inst, const llvm::Type *element_type, unsigned vecsize)
{
	auto &builder = impl.builder();
	spv::Id raw_component_type_id;
	RawAccessChain raw = {};

	// If we're storing to min16 types and we use native 16-bit in arithmetic,
	// we have to expand to 32-bit before storing :(
	// This will probably fall over with int vs uint, since we don't know how to sign-extend.
	if (!impl.execution_mode_meta.native_16bit_operations &&
	    impl.options.min_precision_prefer_native_16bit &&
	    type_is_16bit(element_type))
	{
		if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
			raw_component_type_id = builder.makeFloatType(32);
		else
			raw_component_type_id = builder.makeUintType(32);
	}
	else
		raw_component_type_id = impl.get_type_id(element_type);

	spv::Id vec_type = vecsize > 1 ? builder.makeVectorType(raw_component_type_id, vecsize) : raw_component_type_id;
	spv::Id ptr_vec_type = builder.makePointer(spv::StorageClassStorageBuffer, vec_type);

	builder.addCapability(spv::CapabilityRawAccessChainsNV);
	builder.addExtension("SPV_NV_raw_access_chains");

	auto *op = impl.allocate(spv::OpRawAccessChainNV, ptr_vec_type);
	op->add_id(impl.get_id_for_value(inst->getOperand(1)));

	unsigned scalar_size = builder.getScalarTypeWidth(raw_component_type_id) / 8;

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		unsigned addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl, element_type);

		if (raw_access_byte_address_can_vectorize(impl, element_type, inst->getOperand(2), 4))
			raw.alignment = 4;
		else if (raw_access_byte_address_can_vectorize(impl, element_type, inst->getOperand(2), 2))
			raw.alignment = 2;
		else
			raw.alignment = 1;

		if (raw.alignment != 1 && raw.alignment * scalar_size <= 16 && vecsize <= raw.alignment)
		{
			// If we can prove vectorization, we can treat this as a structured buffer instead.
			// That way we needlessly avoid per-component robustness.
			// BAB descriptor range is aligned to 16 bytes, so we cannot use PerElementMask if the load
			// can straddle a 16 byte boundary.
			// If we care enough, we can split this load into two, and use per-element on both, but that's overkill.

			spv::Id element_id = build_index_divider(impl, inst->getOperand(2), addr_shift_log2, raw.alignment);
			op->add_id(builder.makeUintConstant(raw.alignment * scalar_size));
			op->add_id(element_id);
			op->add_id(builder.makeUintConstant(0));
			op->add_literal(spv::RawAccessChainOperandsRobustnessPerElementNVMask);
		}
		else
		{
			op->add_id(builder.makeUintConstant(0));
			op->add_id(builder.makeUintConstant(0));
			op->add_id(impl.get_id_for_value(inst->getOperand(2)));
			op->add_literal(spv::RawAccessChainOperandsRobustnessPerComponentNVMask);
		}
	}
	else
	{
		op->add_id(builder.makeUintConstant(meta.stride));
		op->add_id(impl.get_id_for_value(inst->getOperand(2)));
		op->add_id(impl.get_id_for_value(inst->getOperand(3)));
		op->add_literal(spv::RawAccessChainOperandsRobustnessPerElementNVMask);

		// Need extra check for stride alignment since we can normally "vectorize" vec3 structured buffers
		// if SSBO alignment is 4. However, we also need to make sure the alignment is correct before accepting.
		if ((meta.stride & (scalar_size * 4 - 1)) == 0 &&
		    raw_access_structured_can_vectorize(
			    impl, element_type,
			    inst->getOperand(2), meta.stride, inst->getOperand(3), 4))
		{
			raw.alignment = 4;
		}
		else if ((meta.stride & (scalar_size * 2 - 1)) == 0 &&
		         raw_access_structured_can_vectorize(
			         impl, element_type,
			         inst->getOperand(2), meta.stride,
			         inst->getOperand(3), 2))
		{
			raw.alignment = 2;
		}
		else
			raw.alignment = 1;
	}

	raw.alignment *= scalar_size;
	raw.component_type_id = raw_component_type_id;
	raw.vector_type_id = vec_type;
	raw.ptr_id = op->id;

	impl.add(op);

	if (meta.non_uniform)
		builder.addDecoration(op->id, spv::DecorationNonUniform);

	if (meta.physical_pointer_meta.nonwritable)
		builder.addDecoration(op->id, spv::DecorationNonWritable);
	if (meta.physical_pointer_meta.coherent)
		builder.addDecoration(op->id, spv::DecorationCoherent);

	return raw;
}